

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O1

int Gia_ManQuantExist2(Gia_Man_t *p0,int iLit,_func_int_void_ptr_int *pFuncCiToKeep,void *pData)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Vec_Int_t *p;
  int *piVar4;
  Vec_Int_t *p_00;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long lVar5;
  long extraout_RDX_02;
  long lVar6;
  uint uVar7;
  uint Entry;
  long lVar8;
  bool bVar9;
  int OutLit;
  Vec_Int_t *vCis;
  int pLits [2];
  uint local_54;
  Vec_Int_t *local_50;
  Gia_Man_t *local_48;
  Vec_Int_t *local_40;
  uint local_38 [2];
  
  if (iLit < 0) {
LAB_00206134:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  if (p0->nObjs <= (int)((uint)iLit >> 1)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  local_54 = 0xffffffff;
  if (1 < iLit) {
    uVar7 = (uint)*(undefined8 *)(p0->pObjs + ((uint)iLit >> 1));
    if ((~uVar7 & 0x9fffffff) == 0) {
      iVar2 = (*pFuncCiToKeep)(pData,(uint)((ulong)*(undefined8 *)(p0->pObjs + ((uint)iLit >> 1)) >>
                                           0x20) & 0x1fffffff);
      if (iVar2 == 0) {
        iLit = 1;
      }
    }
    else {
      if (((int)uVar7 < 0) || ((uVar7 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                      ,300,"int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)")
        ;
      }
      pGVar3 = Gia_ManQuantDupConeSupp(p0,iLit,pFuncCiToKeep,pData,&local_50,(int *)&local_54);
      iVar2 = pGVar3->iSuppPi;
      if (iVar2 == 0) {
        Gia_ManStop(pGVar3);
        if (local_50->pArray != (int *)0x0) {
          free(local_50->pArray);
          local_50->pArray = (int *)0x0;
        }
LAB_00206054:
        if (local_50 != (Vec_Int_t *)0x0) {
          free(local_50);
        }
      }
      else {
        if ((iVar2 < 1) || (pGVar3->nSuppWords * 0x40 < iVar2)) {
          __assert_fail("pNew->iSuppPi > 0 && pNew->iSuppPi <= 64 * pNew->nSuppWords",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                        ,0x134,
                        "int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)");
        }
        local_48 = pGVar3;
        p = (Vec_Int_t *)malloc(0x10);
        p->nCap = 100;
        p->nSize = 0;
        piVar4 = (int *)malloc(400);
        p->pArray = piVar4;
        p_00 = (Vec_Int_t *)malloc(0x10);
        p_00->nCap = 100;
        p_00->nSize = 0;
        piVar4 = (int *)malloc(400);
        p_00->pArray = piVar4;
        if ((int)local_54 < 2) {
          __assert_fail("OutLit > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                        ,0x137,
                        "int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)");
        }
        Vec_IntPush(p,local_54);
        iVar2 = local_48->iSuppPi;
        local_48->iSuppPi = iVar2 + -1;
        pGVar3 = local_48;
        if (0 < iVar2) {
          local_40 = &local_48->vCopiesTwo;
          lVar5 = extraout_RDX;
          pVVar1 = p_00;
          do {
            p_00 = p;
            p = pVVar1;
            if (p_00->nSize < 1) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (*p_00->pArray < 0) goto LAB_00206134;
            iVar2 = pGVar3->nObjs * 2;
            if ((pGVar3->vCopiesTwo).nSize < iVar2) {
              Vec_IntFillExtra(local_40,iVar2,(int)lVar5);
            }
            if (p_00->nSize < 1) {
              __assert_fail("Vec_IntSize(vOuts) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                            ,0x142,
                            "int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)"
                           );
            }
            p->nSize = 0;
            Gia_ManIncrementTravId(pGVar3);
            lVar5 = extraout_RDX_00;
            if (0 < p_00->nSize) {
              lVar8 = 0;
              do {
                uVar7 = p_00->pArray[lVar8];
                if ((int)uVar7 < 0) goto LAB_00206134;
                Gia_ManQuantExist_rec(pGVar3,uVar7 >> 1,(int *)local_38);
                lVar5 = extraout_RDX_01;
                lVar6 = 0;
                do {
                  if ((int)local_38[lVar6] < 0) {
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                  ,0x132,"int Abc_LitNotCond(int, int)");
                  }
                  Entry = local_38[lVar6] ^ uVar7 & 1;
                  if (Entry != 0) {
                    if (Entry == 1) {
                      if (p_00->pArray != (int *)0x0) {
                        free(p_00->pArray);
                        p_00->pArray = (int *)0x0;
                      }
                      pGVar3 = local_48;
                      if (p_00 != (Vec_Int_t *)0x0) {
                        free(p_00);
                      }
                      if (p->pArray != (int *)0x0) {
                        free(p->pArray);
                        p->pArray = (int *)0x0;
                      }
                      if (p != (Vec_Int_t *)0x0) {
                        free(p);
                      }
                      Gia_ManStop(pGVar3);
                      if (local_50->pArray != (int *)0x0) {
                        free(local_50->pArray);
                        local_50->pArray = (int *)0x0;
                      }
                      iLit = 1;
                      goto LAB_00206054;
                    }
                    if (0 < (long)p->nSize) {
                      lVar5 = 0;
                      do {
                        if (p->pArray[lVar5] == Entry) goto LAB_00205f76;
                        lVar5 = lVar5 + 1;
                      } while (p->nSize != lVar5);
                    }
                    Vec_IntPush(p,Entry);
                    lVar5 = extraout_RDX_02;
                  }
LAB_00205f76:
                  bVar9 = lVar6 == 0;
                  lVar6 = lVar6 + 1;
                } while (bVar9);
                lVar8 = lVar8 + 1;
                pGVar3 = local_48;
              } while (lVar8 < p_00->nSize);
            }
            p_00->nSize = 0;
            iVar2 = pGVar3->iSuppPi;
            pGVar3->iSuppPi = iVar2 + -1;
            pVVar1 = p_00;
          } while (0 < iVar2);
        }
        if (p->nSize < 1) {
          __assert_fail("Vec_IntSize(vOuts) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                        ,0x15d,
                        "int Gia_ManQuantExist2(Gia_Man_t *, int, int (*)(void *, int), void *)");
        }
        if (0 < p->nSize) {
          piVar4 = p->pArray;
          lVar5 = 0;
          do {
            uVar7 = piVar4[lVar5];
            if ((int)uVar7 < 0) goto LAB_00206153;
            piVar4[lVar5] = uVar7 ^ 1;
            lVar5 = lVar5 + 1;
          } while (lVar5 < p->nSize);
        }
        local_54 = Gia_ManHashAndMulti(pGVar3,p);
        if ((int)local_54 < 0) {
LAB_00206153:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x131,"int Abc_LitNot(int)");
        }
        local_54 = local_54 ^ 1;
        Vec_IntFree(p);
        Vec_IntFree(p_00);
        Gia_ManAppendCo(pGVar3,local_54);
        iLit = Gia_ManDupConeBack(p0,pGVar3,local_50);
        Gia_ManStop(pGVar3);
        Vec_IntFree(local_50);
      }
    }
  }
  return iLit;
}

Assistant:

int Gia_ManQuantExist2( Gia_Man_t * p0, int iLit, int(*pFuncCiToKeep)(void *, int), void * pData )
{
//    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;
    Vec_Int_t * vOuts, * vOuts2, * vCis; 
    Gia_Obj_t * pObj = Gia_ManObj( p0, Abc_Lit2Var(iLit) );
    int i, n, Entry, Lit, OutLit = -1, pLits[2], nVarsQua, nAndsOld, nAndsNew; 
    if ( iLit < 2 ) return iLit;
    if ( Gia_ObjIsCi(pObj) ) return pFuncCiToKeep(pData, Gia_ObjCioId(pObj)) ? iLit : 1;
    assert( Gia_ObjIsAnd(pObj) );
    pNew = Gia_ManQuantDupConeSupp( p0, iLit, pFuncCiToKeep, pData, &vCis, &OutLit );
    if ( pNew->iSuppPi == 0 )
    {
        Gia_ManStop( pNew );
        Vec_IntFree( vCis );
        return iLit;
    }
    assert( pNew->iSuppPi > 0 && pNew->iSuppPi <= 64 * pNew->nSuppWords );
    vOuts = Vec_IntAlloc( 100 );
    vOuts2 = Vec_IntAlloc( 100 );
    assert( OutLit > 1 );
    Vec_IntPush( vOuts, OutLit );
    nVarsQua = pNew->iSuppPi;
    nAndsOld = Gia_ManAndNum(pNew);
    while ( --pNew->iSuppPi >= 0 )
    {
        Entry = Abc_Lit2Var( Vec_IntEntry(vOuts, 0) );
//        printf( "Quantifying input %d with %d affected nodes (out of %d):\n", 
//            pNew->iSuppPi, Gia_ManQuantCountUsed(pNew,Entry), Gia_ManAndNum(pNew) );
        if ( Vec_IntSize(&pNew->vCopiesTwo) < 2*Gia_ManObjNum(pNew) )
            Vec_IntFillExtra( &pNew->vCopiesTwo, 2*Gia_ManObjNum(pNew), -1 );
        assert( Vec_IntSize(vOuts) > 0 );
        Vec_IntClear( vOuts2 );
        Gia_ManIncrementTravId( pNew );
        Vec_IntForEachEntry( vOuts, Entry, i )
        {
            Gia_ManQuantExist_rec( pNew, Abc_Lit2Var(Entry), pLits );
            for ( n = 0; n < 2; n++ )
            {
                Lit = Abc_LitNotCond( pLits[n], Abc_LitIsCompl(Entry) );
                if ( Lit == 0 )
                    continue;
                if ( Lit == 1 )
                {
                    Vec_IntFree( vOuts );
                    Vec_IntFree( vOuts2 );
                    Gia_ManStop( pNew );
                    Vec_IntFree( vCis );
                    return 1;
                }
                Vec_IntPushUnique( vOuts2, Lit );
            }
        }
        Vec_IntClear( vOuts );
        ABC_SWAP( Vec_Int_t *, vOuts, vOuts2 );
    }
//    printf( "\n" );
    //printf( "The number of diff cofactors = %d.\n", Vec_IntSize(vOuts) );
    assert( Vec_IntSize(vOuts) > 0 );
    Vec_IntForEachEntry( vOuts, Entry, i )
        Vec_IntWriteEntry( vOuts, i, Abc_LitNot(Entry) );
    OutLit = Gia_ManHashAndMulti( pNew, vOuts );
    OutLit = Abc_LitNot( OutLit );
    Vec_IntFree( vOuts );
    Vec_IntFree( vOuts2 );
    // transfer back
    Gia_ManAppendCo( pNew, OutLit );
    nAndsNew = Gia_ManAndNum(p0);
    Lit = Gia_ManDupConeBack( p0, pNew, vCis );
    nAndsNew = Gia_ManAndNum(p0) - nAndsNew;
    Gia_ManStop( pNew );
    // report the result
//    printf( "Performed quantification with %6d nodes, %3d keep-vars, %3d quant-vars, resulting in %5d new nodes. \n", 
//        nAndsOld, Vec_IntSize(vCis) - nVarsQua, nVarsQua, nAndsNew );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Vec_IntFree( vCis );
    return Lit;
}